

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::SubGridIntersectorKMoeller<4,_8,_true>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<8> *ray
                ,TravRayK<8,_false> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Geometry *pGVar3;
  long lVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  long lVar12;
  ulong uVar13;
  ulong *puVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  long lVar22;
  ulong *puVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  long lVar34;
  Geometry *geometry;
  long lVar35;
  ulong *puVar36;
  bool bVar37;
  bool bVar38;
  ulong uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  float fVar60;
  float fVar66;
  float fVar67;
  vint4 ai_1;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar65 [32];
  float fVar72;
  float fVar77;
  float fVar78;
  vint4 ai_3;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar79;
  float fVar80;
  float fVar83;
  float fVar84;
  vint4 ai;
  undefined1 auVar81 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  undefined1 auVar82 [32];
  vint4 ai_2;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  vint4 ai_4;
  undefined1 auVar93 [16];
  vint4 ai_6;
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar99;
  float fVar100;
  float fVar101;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  uint uVar102;
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [64];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  undefined1 auVar115 [64];
  RTCFilterFunctionNArguments args;
  MoellerTrumboreHitM<8,_embree::avx512::UVIdentity<8>_> hit;
  NodeRef stack [244];
  ulong *local_c58;
  ulong local_c48;
  RTCFilterFunctionNArguments local_b30;
  undefined1 local_b00 [32];
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  byte local_a3f;
  float local_a20 [4];
  float fStack_a10;
  float fStack_a0c;
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 uStack_908;
  undefined4 uStack_904;
  undefined1 local_900 [32];
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 uStack_8c8;
  undefined4 uStack_8c4;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined1 local_860 [32];
  uint local_840;
  uint uStack_83c;
  uint uStack_838;
  uint uStack_834;
  uint uStack_830;
  uint uStack_82c;
  uint uStack_828;
  uint uStack_824;
  uint local_820;
  uint uStack_81c;
  uint uStack_818;
  uint uStack_814;
  uint uStack_810;
  uint uStack_80c;
  uint uStack_808;
  uint uStack_804;
  size_t local_800;
  ulong local_7f8 [249];
  
  puVar23 = local_7f8;
  local_800 = root.ptr;
  auVar40 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4)));
  auVar105 = ZEXT1664(auVar40);
  auVar41 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x20)));
  auVar106 = ZEXT1664(auVar41);
  auVar42 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)&(tray->rdir).field_0 + k * 4 + 0x40)));
  auVar107 = ZEXT1664(auVar42);
  auVar40 = vmulss_avx512f(auVar40,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4)));
  auVar43._0_4_ = auVar40._0_4_;
  auVar43._4_4_ = auVar43._0_4_;
  auVar43._8_4_ = auVar43._0_4_;
  auVar43._12_4_ = auVar43._0_4_;
  auVar40 = vmulss_avx512f(auVar41,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x20)));
  auVar41._0_4_ = auVar40._0_4_;
  auVar41._4_4_ = auVar41._0_4_;
  auVar41._8_4_ = auVar41._0_4_;
  auVar41._12_4_ = auVar41._0_4_;
  auVar40 = vmulss_avx512f(auVar42,ZEXT416(*(uint *)((long)&(tray->org).field_0 + k * 4 + 0x40)));
  auVar42._0_4_ = auVar40._0_4_;
  auVar42._4_4_ = auVar42._0_4_;
  auVar42._8_4_ = auVar42._0_4_;
  auVar42._12_4_ = auVar42._0_4_;
  uVar30 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar31 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar32 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x40);
  auVar89._8_4_ = 0x80000000;
  auVar89._0_8_ = 0x8000000080000000;
  auVar89._12_4_ = 0x80000000;
  auVar40 = vxorps_avx512vl(auVar43,auVar89);
  auVar108 = ZEXT1664(auVar40);
  auVar40 = vxorps_avx512vl(auVar41,auVar89);
  auVar109 = ZEXT1664(auVar40);
  auVar40 = vxorps_avx512vl(auVar42,auVar89);
  auVar110 = ZEXT1664(auVar40);
  auVar40 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tnear).field_0.i[k]));
  auVar111 = ZEXT1664(auVar40);
  auVar40 = vpbroadcastd_avx512vl(ZEXT416((uint)(tray->tfar).field_0.i[k]));
  auVar112 = ZEXT1664(auVar40);
  auVar40 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
  auVar113 = ZEXT1664(auVar40);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar114 = ZEXT3264(auVar45);
  auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar115 = ZEXT3264(auVar45);
  local_940 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_c58 = puVar23;
  do {
    puVar26 = local_c58;
    if (puVar26 == &local_800) break;
    local_c58 = puVar26 + -1;
    uVar28 = puVar26[-1];
    do {
      if ((uVar28 & 8) == 0) {
        auVar40 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar30),auVar108._0_16_,
                             auVar105._0_16_);
        auVar41 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar31),auVar109._0_16_,
                             auVar106._0_16_);
        auVar40 = vpmaxsd_avx(auVar40,auVar41);
        auVar42 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar28 + 0x20 + uVar32),auVar110._0_16_,
                             auVar107._0_16_);
        auVar41 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar30 ^ 0x10)),auVar108._0_16_
                             ,auVar105._0_16_);
        auVar43 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar31 ^ 0x10)),auVar109._0_16_
                             ,auVar106._0_16_);
        auVar41 = vpminsd_avx(auVar41,auVar43);
        auVar43 = vfmadd132ps_avx512vl
                            (*(undefined1 (*) [16])(uVar28 + 0x20 + (uVar32 ^ 0x10)),auVar110._0_16_
                             ,auVar107._0_16_);
        auVar42 = vpmaxsd_avx512vl(auVar42,auVar111._0_16_);
        auVar40 = vpmaxsd_avx(auVar40,auVar42);
        auVar42 = vpminsd_avx512vl(auVar43,auVar112._0_16_);
        auVar41 = vpminsd_avx(auVar41,auVar42);
        uVar11 = vpcmpd_avx512vl(auVar40,auVar41,2);
        puVar23 = (ulong *)CONCAT44((int)((ulong)puVar23 >> 0x20),(uint)((byte)uVar11 & 0xf));
      }
      if ((uVar28 & 8) == 0) {
        if (puVar23 == (ulong *)0x0) {
          uVar102 = 4;
        }
        else {
          uVar27 = uVar28 & 0xfffffffffffffff0;
          lVar12 = 0;
          for (puVar36 = puVar23; ((ulong)puVar36 & 1) == 0;
              puVar36 = (ulong *)((ulong)puVar36 >> 1 | 0x8000000000000000)) {
            lVar12 = lVar12 + 1;
          }
          uVar102 = 0;
          uVar24 = (long)puVar23 - 1U & (ulong)puVar23;
          uVar28 = *(ulong *)(uVar27 + lVar12 * 8);
          if (uVar24 != 0) {
            *local_c58 = uVar28;
            lVar12 = 0;
            for (uVar28 = uVar24; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
              lVar12 = lVar12 + 1;
            }
            uVar28 = *(ulong *)(uVar27 + lVar12 * 8);
            for (uVar24 = uVar24 - 1 & uVar24; local_c58 = local_c58 + 1, uVar24 != 0;
                uVar24 = uVar24 - 1 & uVar24) {
              *local_c58 = uVar28;
              lVar12 = 0;
              for (uVar28 = uVar24; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
                lVar12 = lVar12 + 1;
              }
              uVar28 = *(ulong *)(uVar27 + lVar12 * 8);
            }
          }
        }
      }
      else {
        uVar102 = 6;
      }
    } while (uVar102 == 0);
    if (uVar102 == 6) {
      uVar27 = (ulong)((uint)uVar28 & 0xf);
      uVar24 = uVar27 - 8;
      bVar37 = uVar27 != 8;
      if (bVar37) {
        uVar28 = uVar28 & 0xfffffffffffffff0;
        uVar27 = 0;
        puVar36 = puVar26;
        do {
          lVar22 = uVar27 * 0x58;
          lVar12 = uVar28 + lVar22;
          auVar40._8_8_ = 0;
          auVar40._0_8_ = *(ulong *)(uVar28 + 0x20 + lVar22);
          auVar44._8_8_ = 0;
          auVar44._0_8_ = *(ulong *)(uVar28 + 0x24 + lVar22);
          uVar11 = vpcmpub_avx512vl(auVar40,auVar44,2);
          uVar1 = *(undefined4 *)(uVar28 + 0x38 + lVar22);
          auVar61._4_4_ = uVar1;
          auVar61._0_4_ = uVar1;
          auVar61._8_4_ = uVar1;
          auVar61._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar28 + 0x44 + lVar22);
          auVar73._4_4_ = uVar1;
          auVar73._0_4_ = uVar1;
          auVar73._8_4_ = uVar1;
          auVar73._12_4_ = uVar1;
          auVar81._8_8_ = 0;
          auVar81._0_8_ = *(ulong *)((uVar30 >> 2) + 0x20 + lVar12);
          auVar40 = vpmovzxbd_avx(auVar81);
          auVar40 = vcvtdq2ps_avx(auVar40);
          auVar41 = vfmadd213ps_fma(auVar40,auVar73,auVar61);
          auVar90._8_8_ = 0;
          auVar90._0_8_ = *(ulong *)(((uVar30 ^ 0x10) >> 2) + 0x20 + lVar12);
          auVar40 = vpmovzxbd_avx(auVar90);
          auVar40 = vcvtdq2ps_avx(auVar40);
          auVar42 = vfmadd213ps_fma(auVar40,auVar73,auVar61);
          uVar1 = *(undefined4 *)(uVar28 + 0x3c + lVar22);
          auVar62._4_4_ = uVar1;
          auVar62._0_4_ = uVar1;
          auVar62._8_4_ = uVar1;
          auVar62._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar28 + 0x48 + lVar22);
          auVar74._4_4_ = uVar1;
          auVar74._0_4_ = uVar1;
          auVar74._8_4_ = uVar1;
          auVar74._12_4_ = uVar1;
          auVar91._8_8_ = 0;
          auVar91._0_8_ = *(ulong *)((uVar31 >> 2) + 0x20 + lVar12);
          auVar40 = vpmovzxbd_avx(auVar91);
          auVar40 = vcvtdq2ps_avx(auVar40);
          auVar43 = vfmadd213ps_fma(auVar40,auVar74,auVar62);
          auVar92._8_8_ = 0;
          auVar92._0_8_ = *(ulong *)(((uVar31 ^ 0x10) >> 2) + 0x20 + lVar12);
          auVar40 = vpmovzxbd_avx(auVar92);
          auVar40 = vcvtdq2ps_avx(auVar40);
          auVar89 = vfmadd213ps_fma(auVar40,auVar74,auVar62);
          uVar1 = *(undefined4 *)(uVar28 + 0x40 + lVar22);
          auVar63._4_4_ = uVar1;
          auVar63._0_4_ = uVar1;
          auVar63._8_4_ = uVar1;
          auVar63._12_4_ = uVar1;
          uVar1 = *(undefined4 *)(uVar28 + 0x4c + lVar22);
          auVar75._4_4_ = uVar1;
          auVar75._0_4_ = uVar1;
          auVar75._8_4_ = uVar1;
          auVar75._12_4_ = uVar1;
          auVar93._8_8_ = 0;
          auVar93._0_8_ = *(ulong *)((uVar32 >> 2) + 0x20 + lVar12);
          auVar40 = vpmovzxbd_avx(auVar93);
          auVar40 = vcvtdq2ps_avx(auVar40);
          auVar61 = vfmadd213ps_fma(auVar40,auVar75,auVar63);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)(((uVar32 ^ 0x10) >> 2) + 0x20 + lVar12);
          auVar40 = vpmovzxbd_avx(auVar94);
          auVar40 = vcvtdq2ps_avx(auVar40);
          auVar62 = vfmadd213ps_fma(auVar40,auVar75,auVar63);
          auVar40 = vfmadd213ps_avx512vl(auVar41,auVar105._0_16_,auVar108._0_16_);
          auVar41 = vfmadd213ps_avx512vl(auVar43,auVar106._0_16_,auVar109._0_16_);
          auVar40 = vpmaxsd_avx(auVar40,auVar41);
          auVar43 = vfmadd213ps_avx512vl(auVar61,auVar107._0_16_,auVar110._0_16_);
          auVar41 = vfmadd213ps_avx512vl(auVar42,auVar105._0_16_,auVar108._0_16_);
          auVar42 = vfmadd213ps_avx512vl(auVar89,auVar106._0_16_,auVar109._0_16_);
          auVar41 = vpminsd_avx(auVar41,auVar42);
          auVar42 = vfmadd213ps_avx512vl(auVar62,auVar107._0_16_,auVar110._0_16_);
          auVar43 = vpmaxsd_avx512vl(auVar43,auVar111._0_16_);
          auVar40 = vpmaxsd_avx(auVar40,auVar43);
          auVar42 = vpminsd_avx512vl(auVar42,auVar112._0_16_);
          auVar41 = vpminsd_avx(auVar41,auVar42);
          uVar39 = vpcmpd_avx512vl(auVar40,auVar41,2);
          uVar39 = ((byte)uVar11 & 0xf) & uVar39;
          if ((char)uVar39 != '\0') {
            do {
              lVar22 = 0;
              for (uVar13 = uVar39; (uVar13 & 1) == 0; uVar13 = uVar13 >> 1 | 0x8000000000000000) {
                lVar22 = lVar22 + 1;
              }
              pGVar3 = (context->scene->geometries).items[*(uint *)(lVar12 + 0x50)].ptr;
              lVar4 = *(long *)&pGVar3->field_0x58;
              lVar5 = *(long *)&pGVar3[1].time_range.upper;
              lVar29 = pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i *
                       (ulong)*(uint *)(lVar12 + 4 + lVar22 * 8);
              uVar13 = *(ulong *)(lVar12 + lVar22 * 8);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = uVar13;
              auVar40 = vpandq_avx512vl(auVar64,auVar113._0_16_);
              auVar61 = vpmovzxwd_avx(auVar40);
              auVar76._8_8_ = 0;
              auVar76._0_8_ = *(ulong *)(lVar4 + lVar29);
              auVar40 = vpaddd_avx(auVar76,auVar61);
              auVar41 = vpmulld_avx(auVar76,auVar61);
              auVar41 = vpsrlq_avx(auVar41,0x20);
              auVar40 = vpaddd_avx(auVar40,auVar41);
              lVar35 = CONCAT44((int)((ulong)puVar36 >> 0x20),auVar40._0_4_);
              p_Var6 = pGVar3[1].intersectionFilterN;
              auVar40 = *(undefined1 (*) [16])(lVar5 + (lVar35 + 1) * (long)p_Var6);
              uVar33 = *(ulong *)(lVar4 + lVar29) >> 0x20;
              lVar34 = uVar33 + lVar35 + 1;
              auVar41 = *(undefined1 (*) [16])(lVar5 + (uVar33 + lVar35) * (long)p_Var6);
              auVar42 = *(undefined1 (*) [16])(lVar5 + lVar34 * (long)p_Var6);
              uVar25 = (ulong)(-1 < (short)uVar13);
              auVar43 = *(undefined1 (*) [16])(lVar5 + (lVar35 + uVar25 + 1) * (long)p_Var6);
              lVar22 = uVar25 + lVar34;
              puVar36 = (ulong *)(lVar22 * (long)p_Var6);
              auVar89 = *(undefined1 (*) [16])(lVar5 + (long)puVar36);
              uVar25 = 0;
              if (-1 < (short)(uVar13 >> 0x10)) {
                uVar25 = uVar33;
              }
              auVar62 = *(undefined1 (*) [16])(lVar5 + (uVar33 + lVar35 + uVar25) * (long)p_Var6);
              auVar63 = *(undefined1 (*) [16])(lVar5 + (lVar34 + uVar25) * (long)p_Var6);
              auVar51._16_16_ = *(undefined1 (*) [16])(lVar5 + (uVar25 + lVar22) * (long)p_Var6);
              auVar51._0_16_ = auVar42;
              auVar73 = vunpcklps_avx(auVar40,auVar89);
              auVar44 = vunpckhps_avx(auVar40,auVar89);
              auVar74 = vunpcklps_avx(auVar43,auVar42);
              auVar43 = vunpckhps_avx(auVar43,auVar42);
              auVar75 = vunpcklps_avx(auVar44,auVar43);
              auVar81 = vunpcklps_avx(auVar73,auVar74);
              auVar43 = vunpckhps_avx(auVar73,auVar74);
              auVar73 = vunpcklps_avx(auVar41,auVar63);
              auVar44 = vunpckhps_avx(auVar41,auVar63);
              auVar74 = vunpcklps_avx(auVar42,auVar62);
              auVar62 = vunpckhps_avx(auVar42,auVar62);
              auVar44 = vunpcklps_avx(auVar44,auVar62);
              auVar90 = vunpcklps_avx(auVar73,auVar74);
              auVar62 = vunpckhps_avx(auVar73,auVar74);
              auVar55._16_16_ = auVar63;
              auVar55._0_16_ = auVar41;
              auVar56._16_16_ = auVar89;
              auVar56._0_16_ = auVar40;
              auVar45 = vunpcklps_avx(auVar56,auVar55);
              auVar57._16_16_ = auVar42;
              auVar57._0_16_ = *(undefined1 (*) [16])(lVar5 + (long)p_Var6 * lVar35);
              auVar58 = vunpcklps_avx(auVar57,auVar51);
              auVar49 = vunpcklps_avx(auVar58,auVar45);
              auVar50 = vunpckhps_avx(auVar58,auVar45);
              auVar45 = vunpckhps_avx(auVar56,auVar55);
              auVar58 = vunpckhps_avx(auVar57,auVar51);
              auVar51 = vunpcklps_avx(auVar58,auVar45);
              auVar45._16_16_ = auVar81;
              auVar45._0_16_ = auVar81;
              auVar58._16_16_ = auVar43;
              auVar58._0_16_ = auVar43;
              auVar54._16_16_ = auVar75;
              auVar54._0_16_ = auVar75;
              auVar53._16_16_ = auVar90;
              auVar53._0_16_ = auVar90;
              auVar97._16_16_ = auVar62;
              auVar97._0_16_ = auVar62;
              auVar95._16_16_ = auVar44;
              auVar95._0_16_ = auVar44;
              auVar45 = vsubps_avx(auVar49,auVar45);
              auVar58 = vsubps_avx(auVar50,auVar58);
              auVar57 = vsubps_avx(auVar51,auVar54);
              auVar56 = vsubps_avx(auVar53,auVar49);
              auVar55 = vsubps_avx(auVar97,auVar50);
              auVar54 = vsubps_avx(auVar95,auVar51);
              auVar46._4_4_ = auVar58._4_4_ * auVar54._4_4_;
              auVar46._0_4_ = auVar58._0_4_ * auVar54._0_4_;
              auVar46._8_4_ = auVar58._8_4_ * auVar54._8_4_;
              auVar46._12_4_ = auVar58._12_4_ * auVar54._12_4_;
              auVar46._16_4_ = auVar58._16_4_ * auVar54._16_4_;
              auVar46._20_4_ = auVar58._20_4_ * auVar54._20_4_;
              auVar46._24_4_ = auVar58._24_4_ * auVar54._24_4_;
              auVar46._28_4_ = auVar81._12_4_;
              auVar40 = vfmsub231ps_fma(auVar46,auVar55,auVar57);
              auVar47._4_4_ = auVar57._4_4_ * auVar56._4_4_;
              auVar47._0_4_ = auVar57._0_4_ * auVar56._0_4_;
              auVar47._8_4_ = auVar57._8_4_ * auVar56._8_4_;
              auVar47._12_4_ = auVar57._12_4_ * auVar56._12_4_;
              auVar47._16_4_ = auVar57._16_4_ * auVar56._16_4_;
              auVar47._20_4_ = auVar57._20_4_ * auVar56._20_4_;
              auVar47._24_4_ = auVar57._24_4_ * auVar56._24_4_;
              auVar47._28_4_ = auVar43._12_4_;
              auVar41 = vfmsub231ps_fma(auVar47,auVar54,auVar45);
              auVar52._4_4_ = auVar45._4_4_ * auVar55._4_4_;
              auVar52._0_4_ = auVar45._0_4_ * auVar55._0_4_;
              auVar52._8_4_ = auVar45._8_4_ * auVar55._8_4_;
              auVar52._12_4_ = auVar45._12_4_ * auVar55._12_4_;
              auVar52._16_4_ = auVar45._16_4_ * auVar55._16_4_;
              auVar52._20_4_ = auVar45._20_4_ * auVar55._20_4_;
              auVar52._24_4_ = auVar45._24_4_ * auVar55._24_4_;
              auVar52._28_4_ = auVar75._12_4_;
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar98._4_4_ = uVar1;
              auVar98._0_4_ = uVar1;
              auVar98._8_4_ = uVar1;
              auVar98._12_4_ = uVar1;
              auVar98._16_4_ = uVar1;
              auVar98._20_4_ = uVar1;
              auVar98._24_4_ = uVar1;
              auVar98._28_4_ = uVar1;
              auVar46 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
              auVar47 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
              uVar1 = *(undefined4 *)(ray + k * 4);
              auVar48._4_4_ = uVar1;
              auVar48._0_4_ = uVar1;
              auVar48._8_4_ = uVar1;
              auVar48._12_4_ = uVar1;
              auVar48._16_4_ = uVar1;
              auVar48._20_4_ = uVar1;
              auVar48._24_4_ = uVar1;
              auVar48._28_4_ = uVar1;
              auVar48 = vsubps_avx512vl(auVar49,auVar48);
              auVar42 = vfmsub231ps_fma(auVar52,auVar56,auVar58);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x20);
              auVar49._4_4_ = uVar1;
              auVar49._0_4_ = uVar1;
              auVar49._8_4_ = uVar1;
              auVar49._12_4_ = uVar1;
              auVar49._16_4_ = uVar1;
              auVar49._20_4_ = uVar1;
              auVar49._24_4_ = uVar1;
              auVar49._28_4_ = uVar1;
              auVar49 = vsubps_avx512vl(auVar50,auVar49);
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x40);
              auVar50._4_4_ = uVar1;
              auVar50._0_4_ = uVar1;
              auVar50._8_4_ = uVar1;
              auVar50._12_4_ = uVar1;
              auVar50._16_4_ = uVar1;
              auVar50._20_4_ = uVar1;
              auVar50._24_4_ = uVar1;
              auVar50._28_4_ = uVar1;
              auVar50 = vsubps_avx512vl(auVar51,auVar50);
              auVar51 = vmulps_avx512vl(auVar46,auVar50);
              auVar51 = vfmsub231ps_avx512vl(auVar51,auVar49,auVar47);
              auVar52 = vmulps_avx512vl(auVar47,auVar48);
              auVar52 = vfmsub231ps_avx512vl(auVar52,auVar50,auVar98);
              auVar53 = vmulps_avx512vl(auVar98,auVar49);
              auVar53 = vfmsub231ps_avx512vl(auVar53,auVar48,auVar46);
              auVar47 = vmulps_avx512vl(ZEXT1632(auVar42),auVar47);
              auVar46 = vfmadd231ps_avx512vl(auVar47,ZEXT1632(auVar41),auVar46);
              local_a60 = vfmadd231ps_avx512vl(auVar46,ZEXT1632(auVar40),auVar98);
              vandps_avx512vl(local_a60,auVar114._0_32_);
              vandps_avx512vl(local_a60,auVar115._0_32_);
              auVar54 = vmulps_avx512vl(auVar54,auVar53);
              auVar55 = vfmadd231ps_avx512vl(auVar54,auVar52,auVar55);
              auVar56 = vfmadd231ps_avx512vl(auVar55,auVar51,auVar56);
              fVar80 = local_a60._0_4_;
              auVar96._0_4_ = (float)((uint)fVar80 ^ auVar56._0_4_);
              fVar83 = local_a60._4_4_;
              auVar96._4_4_ = (float)((uint)fVar83 ^ auVar56._4_4_);
              fVar84 = local_a60._8_4_;
              auVar96._8_4_ = (float)((uint)fVar84 ^ auVar56._8_4_);
              fVar85 = local_a60._12_4_;
              auVar96._12_4_ = (float)((uint)fVar85 ^ auVar56._12_4_);
              fVar99 = local_a60._16_4_;
              auVar96._16_4_ = (float)((uint)fVar99 ^ auVar56._16_4_);
              fVar100 = local_a60._20_4_;
              auVar96._20_4_ = (float)((uint)fVar100 ^ auVar56._20_4_);
              fVar101 = local_a60._24_4_;
              auVar96._24_4_ = (float)((uint)fVar101 ^ auVar56._24_4_);
              uVar102 = local_a60._28_4_;
              auVar96._28_4_ = (float)(uVar102 ^ auVar56._28_4_);
              auVar57 = vmulps_avx512vl(auVar57,auVar53);
              auVar58 = vfmadd231ps_avx512vl(auVar57,auVar58,auVar52);
              auVar45 = vfmadd231ps_avx512vl(auVar58,auVar45,auVar51);
              auVar103._0_4_ = (float)((uint)fVar80 ^ auVar45._0_4_);
              auVar103._4_4_ = (float)((uint)fVar83 ^ auVar45._4_4_);
              auVar103._8_4_ = (float)((uint)fVar84 ^ auVar45._8_4_);
              auVar103._12_4_ = (float)((uint)fVar85 ^ auVar45._12_4_);
              auVar103._16_4_ = (float)((uint)fVar99 ^ auVar45._16_4_);
              auVar103._20_4_ = (float)((uint)fVar100 ^ auVar45._20_4_);
              auVar103._24_4_ = (float)((uint)fVar101 ^ auVar45._24_4_);
              auVar103._28_4_ = (float)(uVar102 ^ auVar45._28_4_);
              uVar11 = vcmpps_avx512vl(auVar96,ZEXT832(0) << 0x20,5);
              uVar8 = vcmpps_avx512vl(auVar103,ZEXT832(0) << 0x20,5);
              uVar9 = vcmpps_avx512vl(local_a60,ZEXT832(0) << 0x20,4);
              auVar104._0_4_ = auVar96._0_4_ + auVar103._0_4_;
              auVar104._4_4_ = auVar96._4_4_ + auVar103._4_4_;
              auVar104._8_4_ = auVar96._8_4_ + auVar103._8_4_;
              auVar104._12_4_ = auVar96._12_4_ + auVar103._12_4_;
              auVar104._16_4_ = auVar96._16_4_ + auVar103._16_4_;
              auVar104._20_4_ = auVar96._20_4_ + auVar103._20_4_;
              auVar104._24_4_ = auVar96._24_4_ + auVar103._24_4_;
              auVar104._28_4_ = auVar96._28_4_ + auVar103._28_4_;
              uVar10 = vcmpps_avx512vl(auVar104,local_a60,2);
              local_a3f = (byte)uVar11 & (byte)uVar8 & (byte)uVar9 & (byte)uVar10;
              if (local_a3f != 0) {
                auVar18._4_4_ = auVar42._4_4_ * auVar50._4_4_;
                auVar18._0_4_ = auVar42._0_4_ * auVar50._0_4_;
                auVar18._8_4_ = auVar42._8_4_ * auVar50._8_4_;
                auVar18._12_4_ = auVar42._12_4_ * auVar50._12_4_;
                auVar18._16_4_ = auVar50._16_4_ * 0.0;
                auVar18._20_4_ = auVar50._20_4_ * 0.0;
                auVar18._24_4_ = auVar50._24_4_ * 0.0;
                auVar18._28_4_ = auVar50._28_4_;
                auVar43 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar41),auVar18);
                auVar43 = vfmadd213ps_fma(auVar48,ZEXT1632(auVar40),ZEXT1632(auVar43));
                local_a80._0_4_ = (float)((uint)fVar80 ^ auVar43._0_4_);
                local_a80._4_4_ = (float)((uint)fVar83 ^ auVar43._4_4_);
                local_a80._8_4_ = (float)((uint)fVar84 ^ auVar43._8_4_);
                local_a80._12_4_ = (float)((uint)fVar85 ^ auVar43._12_4_);
                local_a80._16_4_ = fVar99;
                local_a80._20_4_ = fVar100;
                local_a80._24_4_ = fVar101;
                local_a80._28_4_ = uVar102;
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x60);
                auVar15._4_4_ = uVar1;
                auVar15._0_4_ = uVar1;
                auVar15._8_4_ = uVar1;
                auVar15._12_4_ = uVar1;
                auVar15._16_4_ = uVar1;
                auVar15._20_4_ = uVar1;
                auVar15._24_4_ = uVar1;
                auVar15._28_4_ = uVar1;
                auVar45 = vmulps_avx512vl(local_a60,auVar15);
                uVar11 = vcmpps_avx512vl(auVar45,local_a80,1);
                uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
                auVar16._4_4_ = uVar1;
                auVar16._0_4_ = uVar1;
                auVar16._8_4_ = uVar1;
                auVar16._12_4_ = uVar1;
                auVar16._16_4_ = uVar1;
                auVar16._20_4_ = uVar1;
                auVar16._24_4_ = uVar1;
                auVar16._28_4_ = uVar1;
                auVar45 = vmulps_avx512vl(local_a60,auVar16);
                uVar8 = vcmpps_avx512vl(local_a80,auVar45,2);
                local_a3f = (byte)uVar11 & (byte)uVar8 & local_a3f;
                if (local_a3f != 0) {
                  auVar45 = vsubps_avx(local_a60,auVar103);
                  auVar45 = vblendps_avx(auVar96,auVar45,0xf0);
                  auVar58 = vsubps_avx(local_a60,auVar96);
                  auVar58 = vblendps_avx(auVar103,auVar58,0xf0);
                  local_9c0._0_4_ = auVar40._0_4_ * 1.0;
                  local_9c0._4_4_ = auVar40._4_4_ * 1.0;
                  local_9c0._8_4_ = auVar40._8_4_ * 1.0;
                  local_9c0._12_4_ = auVar40._12_4_ * 1.0;
                  local_9c0._16_4_ = 0x80000000;
                  local_9c0._20_4_ = 0x80000000;
                  local_9c0._24_4_ = 0x80000000;
                  local_9c0._28_4_ = 0;
                  local_9a0._4_4_ = auVar41._4_4_ * 1.0;
                  local_9a0._0_4_ = auVar41._0_4_ * 1.0;
                  local_9a0._8_4_ = auVar41._8_4_ * 1.0;
                  local_9a0._12_4_ = auVar41._12_4_ * 1.0;
                  local_9a0._16_4_ = 0x80000000;
                  local_9a0._20_4_ = 0x80000000;
                  local_9a0._24_4_ = 0x80000000;
                  local_9a0._28_4_ = 0;
                  local_980._4_4_ = auVar42._4_4_ * 1.0;
                  local_980._0_4_ = auVar42._0_4_ * 1.0;
                  local_980._8_4_ = auVar42._8_4_ * 1.0;
                  local_980._12_4_ = auVar42._12_4_ * 1.0;
                  local_980._16_4_ = 0x80000000;
                  local_980._20_4_ = 0x80000000;
                  local_980._24_4_ = 0x80000000;
                  local_980._28_4_ = 0;
                  auVar82._8_4_ = 1;
                  auVar82._0_8_ = 0x100000001;
                  auVar82._12_4_ = 1;
                  auVar82._16_4_ = 1;
                  auVar82._20_4_ = 1;
                  auVar82._24_4_ = 1;
                  auVar82._28_4_ = 1;
                  auVar57 = vpermd_avx2(auVar82,ZEXT1632(auVar61));
                  auVar56 = vpaddd_avx2(auVar57,_DAT_0205d4e0);
                  auVar65._0_4_ = auVar61._0_4_;
                  auVar65._4_4_ = auVar65._0_4_;
                  auVar65._8_4_ = auVar65._0_4_;
                  auVar65._12_4_ = auVar65._0_4_;
                  auVar65._16_4_ = auVar65._0_4_;
                  auVar65._20_4_ = auVar65._0_4_;
                  auVar65._24_4_ = auVar65._0_4_;
                  auVar65._28_4_ = auVar65._0_4_;
                  auVar42 = auVar105._0_16_;
                  auVar40 = vcvtsi2ss_avx512f(auVar42,*(ushort *)(lVar4 + 8 + lVar29) - 1);
                  auVar57 = vpaddd_avx2(auVar65,_DAT_0205d4c0);
                  auVar19._12_4_ = 0;
                  auVar19._0_12_ = ZEXT812(0);
                  auVar41 = vrcp14ss_avx512f(auVar19 << 0x20,ZEXT416(auVar40._0_4_));
                  auVar40 = vfnmadd213ss_fma(auVar40,auVar41,SUB6416(ZEXT464(0x40000000),0));
                  fVar71 = auVar41._0_4_ * auVar40._0_4_;
                  auVar40 = vcvtsi2ss_avx512f(auVar42,*(ushort *)(lVar4 + 10 + lVar29) - 1);
                  auVar41 = vrcp14ss_avx512f(auVar19 << 0x20,ZEXT416(auVar40._0_4_));
                  auVar40 = vfnmadd213ss_fma(auVar40,auVar41,SUB6416(ZEXT464(0x40000000),0));
                  fVar88 = auVar41._0_4_ * auVar40._0_4_;
                  auVar57 = vcvtdq2ps_avx(auVar57);
                  fStack_a04 = auVar57._28_4_ + auVar45._28_4_;
                  fVar60 = (fVar80 * auVar57._0_4_ + auVar45._0_4_) * fVar71;
                  fVar66 = (fVar83 * auVar57._4_4_ + auVar45._4_4_) * fVar71;
                  local_ac0._4_4_ = fVar66;
                  local_ac0._0_4_ = fVar60;
                  fVar67 = (fVar84 * auVar57._8_4_ + auVar45._8_4_) * fVar71;
                  local_ac0._8_4_ = fVar67;
                  fVar68 = (fVar85 * auVar57._12_4_ + auVar45._12_4_) * fVar71;
                  local_ac0._12_4_ = fVar68;
                  fVar69 = (fVar99 * auVar57._16_4_ + auVar45._16_4_) * fVar71;
                  local_ac0._16_4_ = fVar69;
                  fVar70 = (fVar100 * auVar57._20_4_ + auVar45._20_4_) * fVar71;
                  local_ac0._20_4_ = fVar70;
                  fVar71 = (fVar101 * auVar57._24_4_ + auVar45._24_4_) * fVar71;
                  local_ac0._24_4_ = fVar71;
                  local_ac0._28_4_ = fStack_a04;
                  auVar45 = vcvtdq2ps_avx(auVar56);
                  fVar80 = (fVar80 * auVar45._0_4_ + auVar58._0_4_) * fVar88;
                  fVar83 = (fVar83 * auVar45._4_4_ + auVar58._4_4_) * fVar88;
                  local_aa0._4_4_ = fVar83;
                  local_aa0._0_4_ = fVar80;
                  fVar84 = (fVar84 * auVar45._8_4_ + auVar58._8_4_) * fVar88;
                  local_aa0._8_4_ = fVar84;
                  fVar85 = (fVar85 * auVar45._12_4_ + auVar58._12_4_) * fVar88;
                  local_aa0._12_4_ = fVar85;
                  fVar86 = (fVar99 * auVar45._16_4_ + auVar58._16_4_) * fVar88;
                  local_aa0._16_4_ = fVar86;
                  fVar87 = (fVar100 * auVar45._20_4_ + auVar58._20_4_) * fVar88;
                  local_aa0._20_4_ = fVar87;
                  fVar88 = (fVar101 * auVar45._24_4_ + auVar58._24_4_) * fVar88;
                  local_aa0._24_4_ = fVar88;
                  local_aa0._28_4_ = auVar45._28_4_ + auVar58._28_4_;
                  if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00806d6a;
                    auVar45 = vrcp14ps_avx512vl(local_a60);
                    auVar17._8_4_ = 0x3f800000;
                    auVar17._0_8_ = &DAT_3f8000003f800000;
                    auVar17._12_4_ = 0x3f800000;
                    auVar17._16_4_ = 0x3f800000;
                    auVar17._20_4_ = 0x3f800000;
                    auVar17._24_4_ = 0x3f800000;
                    auVar17._28_4_ = 0x3f800000;
                    auVar58 = vfnmadd213ps_avx512vl(local_a60,auVar45,auVar17);
                    auVar40 = vfmadd132ps_fma(auVar58,auVar45,auVar45);
                    fVar72 = auVar40._0_4_;
                    fVar77 = auVar40._4_4_;
                    local_9e0._4_4_ = fVar77 * local_a80._4_4_;
                    local_9e0._0_4_ = fVar72 * local_a80._0_4_;
                    fVar78 = auVar40._8_4_;
                    local_9e0._8_4_ = fVar78 * local_a80._8_4_;
                    fVar79 = auVar40._12_4_;
                    local_9e0._12_4_ = fVar79 * local_a80._12_4_;
                    local_9e0._16_4_ = fVar99 * 0.0;
                    local_9e0._20_4_ = fVar100 * 0.0;
                    local_9e0._24_4_ = fVar101 * 0.0;
                    local_9e0._28_4_ = auVar45._28_4_;
                    local_a20[0] = fVar60 * fVar72;
                    local_a20[1] = fVar66 * fVar77;
                    local_a20[2] = fVar67 * fVar78;
                    local_a20[3] = fVar68 * fVar79;
                    fStack_a10 = fVar69 * 0.0;
                    fStack_a0c = fVar70 * 0.0;
                    fStack_a08 = fVar71 * 0.0;
                    local_a00._4_4_ = fVar83 * fVar77;
                    local_a00._0_4_ = fVar80 * fVar72;
                    local_a00._8_4_ = fVar84 * fVar78;
                    local_a00._12_4_ = fVar85 * fVar79;
                    local_a00._16_4_ = fVar86 * 0.0;
                    local_a00._20_4_ = fVar87 * 0.0;
                    local_a00._24_4_ = fVar88 * 0.0;
                    local_a00._28_4_ = fStack_a04;
                    puVar36 = (ulong *)(ulong)local_a3f;
                    bVar38 = puVar36 == (ulong *)0x0;
                    if (!bVar38) {
                      local_c48 = 0;
                      for (puVar14 = puVar36; ((ulong)puVar14 & 1) == 0;
                          puVar14 = (ulong *)((ulong)puVar14 >> 1 | 0x8000000000000000)) {
                        local_c48 = local_c48 + 1;
                      }
                      local_960 = vpbroadcastd_avx512vl();
                      local_b00 = vpbroadcastd_avx512vl();
                      auVar43 = auVar106._0_16_;
                      auVar89 = auVar107._0_16_;
                      auVar61 = auVar108._0_16_;
                      auVar62 = auVar109._0_16_;
                      auVar63 = auVar110._0_16_;
                      auVar40 = vmovdqa64_avx512vl(auVar111._0_16_);
                      auVar41 = vmovdqa64_avx512vl(auVar112._0_16_);
                      do {
                        uVar1 = *(undefined4 *)(ray + k * 4 + 0x100);
                        fVar80 = local_a20[local_c48];
                        local_8c0._4_4_ = fVar80;
                        local_8c0._0_4_ = fVar80;
                        local_8c0._8_4_ = fVar80;
                        local_8c0._12_4_ = fVar80;
                        local_8c0._16_4_ = fVar80;
                        local_8c0._20_4_ = fVar80;
                        local_8c0._24_4_ = fVar80;
                        local_8c0._28_4_ = fVar80;
                        uVar2 = *(undefined4 *)(local_a00 + local_c48 * 4);
                        local_8a0._4_4_ = uVar2;
                        local_8a0._0_4_ = uVar2;
                        local_8a0._8_4_ = uVar2;
                        local_8a0._12_4_ = uVar2;
                        local_8a0._16_4_ = uVar2;
                        local_8a0._20_4_ = uVar2;
                        local_8a0._24_4_ = uVar2;
                        local_8a0._28_4_ = uVar2;
                        *(undefined4 *)(ray + k * 4 + 0x100) =
                             *(undefined4 *)(local_9e0 + local_c48 * 4);
                        local_b30.context = context->user;
                        local_920 = *(undefined4 *)(local_9c0 + local_c48 * 4);
                        uVar2 = *(undefined4 *)(local_9a0 + local_c48 * 4);
                        local_900._4_4_ = uVar2;
                        local_900._0_4_ = uVar2;
                        local_900._8_4_ = uVar2;
                        local_900._12_4_ = uVar2;
                        local_900._16_4_ = uVar2;
                        local_900._20_4_ = uVar2;
                        local_900._24_4_ = uVar2;
                        local_900._28_4_ = uVar2;
                        local_8e0 = *(undefined4 *)(local_980 + local_c48 * 4);
                        uStack_91c = local_920;
                        uStack_918 = local_920;
                        uStack_914 = local_920;
                        uStack_910 = local_920;
                        uStack_90c = local_920;
                        uStack_908 = local_920;
                        uStack_904 = local_920;
                        uStack_8dc = local_8e0;
                        uStack_8d8 = local_8e0;
                        uStack_8d4 = local_8e0;
                        uStack_8d0 = local_8e0;
                        uStack_8cc = local_8e0;
                        uStack_8c8 = local_8e0;
                        uStack_8c4 = local_8e0;
                        local_880 = local_b00._0_8_;
                        uStack_878 = local_b00._8_8_;
                        uStack_870 = local_b00._16_8_;
                        uStack_868 = local_b00._24_8_;
                        local_860 = local_960;
                        vpcmpeqd_avx2(local_960,local_960);
                        uStack_83c = (local_b30.context)->instID[0];
                        local_840 = uStack_83c;
                        uStack_838 = uStack_83c;
                        uStack_834 = uStack_83c;
                        uStack_830 = uStack_83c;
                        uStack_82c = uStack_83c;
                        uStack_828 = uStack_83c;
                        uStack_824 = uStack_83c;
                        uStack_81c = (local_b30.context)->instPrimID[0];
                        local_820 = uStack_81c;
                        uStack_818 = uStack_81c;
                        uStack_814 = uStack_81c;
                        uStack_810 = uStack_81c;
                        uStack_80c = uStack_81c;
                        uStack_808 = uStack_81c;
                        uStack_804 = uStack_81c;
                        local_ae0 = local_940._0_8_;
                        uStack_ad8 = local_940._8_8_;
                        uStack_ad0 = local_940._16_8_;
                        uStack_ac8 = local_940._24_8_;
                        local_b30.valid = (int *)&local_ae0;
                        local_b30.geometryUserPtr = pGVar3->userPtr;
                        local_b30.hit = (RTCHitN *)&local_920;
                        local_b30.N = 8;
                        local_b30.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          (*pGVar3->occlusionFilterN)(&local_b30);
                        }
                        auVar20._8_8_ = uStack_ad8;
                        auVar20._0_8_ = local_ae0;
                        auVar20._16_8_ = uStack_ad0;
                        auVar20._24_8_ = uStack_ac8;
                        if (auVar20 != (undefined1  [32])0x0) {
                          p_Var6 = context->args->filter;
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            (*p_Var6)(&local_b30);
                          }
                          auVar21._8_8_ = uStack_ad8;
                          auVar21._0_8_ = local_ae0;
                          auVar21._16_8_ = uStack_ad0;
                          auVar21._24_8_ = uStack_ac8;
                          uVar13 = vptestmd_avx512vl(auVar21,auVar21);
                          auVar45 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar7 = (bool)((byte)uVar13 & 1);
                          auVar59._0_4_ =
                               (uint)bVar7 * auVar45._0_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x100);
                          bVar7 = (bool)((byte)(uVar13 >> 1) & 1);
                          auVar59._4_4_ =
                               (uint)bVar7 * auVar45._4_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x104);
                          bVar7 = (bool)((byte)(uVar13 >> 2) & 1);
                          auVar59._8_4_ =
                               (uint)bVar7 * auVar45._8_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x108);
                          bVar7 = (bool)((byte)(uVar13 >> 3) & 1);
                          auVar59._12_4_ =
                               (uint)bVar7 * auVar45._12_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x10c);
                          bVar7 = (bool)((byte)(uVar13 >> 4) & 1);
                          auVar59._16_4_ =
                               (uint)bVar7 * auVar45._16_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x110);
                          bVar7 = (bool)((byte)(uVar13 >> 5) & 1);
                          auVar59._20_4_ =
                               (uint)bVar7 * auVar45._20_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x114);
                          bVar7 = (bool)((byte)(uVar13 >> 6) & 1);
                          auVar59._24_4_ =
                               (uint)bVar7 * auVar45._24_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x118);
                          bVar7 = SUB81(uVar13 >> 7,0);
                          auVar59._28_4_ =
                               (uint)bVar7 * auVar45._28_4_ |
                               (uint)!bVar7 * *(int *)(local_b30.ray + 0x11c);
                          *(undefined1 (*) [32])(local_b30.ray + 0x100) = auVar59;
                          if (auVar21 != (undefined1  [32])0x0) {
                            auVar105 = ZEXT1664(auVar42);
                            auVar106 = ZEXT1664(auVar43);
                            auVar107 = ZEXT1664(auVar89);
                            auVar108 = ZEXT1664(auVar61);
                            auVar109 = ZEXT1664(auVar62);
                            auVar110 = ZEXT1664(auVar63);
                            auVar40 = vmovdqa64_avx512vl(auVar40);
                            auVar111 = ZEXT1664(auVar40);
                            auVar40 = vmovdqa64_avx512vl(auVar41);
                            auVar112 = ZEXT1664(auVar40);
                            auVar40 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                            auVar113 = ZEXT1664(auVar40);
                            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar114 = ZEXT3264(auVar45);
                            auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                            auVar115 = ZEXT3264(auVar45);
                            if (!bVar38) goto LAB_00806d6a;
                            break;
                          }
                        }
                        *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                        uVar13 = local_c48 & 0x3f;
                        local_c48 = 0;
                        puVar36 = (ulong *)((ulong)puVar36 ^ 1L << uVar13);
                        for (puVar14 = puVar36; ((ulong)puVar14 & 1) == 0;
                            puVar14 = (ulong *)((ulong)puVar14 >> 1 | 0x8000000000000000)) {
                          local_c48 = local_c48 + 1;
                        }
                        bVar38 = puVar36 == (ulong *)0x0;
                        auVar105 = ZEXT1664(auVar42);
                        auVar106 = ZEXT1664(auVar43);
                        auVar107 = ZEXT1664(auVar89);
                        auVar108 = ZEXT1664(auVar61);
                        auVar109 = ZEXT1664(auVar62);
                        auVar110 = ZEXT1664(auVar63);
                        auVar44 = vmovdqa64_avx512vl(auVar40);
                        auVar111 = ZEXT1664(auVar44);
                        auVar44 = vmovdqa64_avx512vl(auVar41);
                        auVar112 = ZEXT1664(auVar44);
                        auVar44 = vpbroadcastw_avx512vl(ZEXT216(0x7fff));
                        auVar113 = ZEXT1664(auVar44);
                        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar114 = ZEXT3264(auVar45);
                        auVar45 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar115 = ZEXT3264(auVar45);
                      } while (!bVar38);
                    }
                  }
                }
              }
              uVar39 = uVar39 - 1 & uVar39;
            } while (uVar39 != 0);
          }
          uVar27 = uVar27 + 1;
          bVar37 = uVar27 < uVar24;
        } while (uVar27 != uVar24);
      }
LAB_00806d6a:
      uVar102 = 0;
      if (bVar37) {
        *(undefined4 *)(ray + k * 4 + 0x100) = 0xff800000;
        uVar102 = 1;
      }
    }
  } while ((uVar102 & 3) == 0);
  return puVar26 != &local_800;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }